

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall
sznet::net::TcpClient::TcpClient
          (TcpClient *this,EventLoop *loop,InetAddress *serverAddr,string *nameArg)

{
  LogLevel LVar1;
  EventLoop *pEVar2;
  Connector *pCVar3;
  element_type *this_00;
  LogStream *this_01;
  self *psVar4;
  EventLoop *in_R9;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1078 [12];
  Logger local_1068;
  TcpClient *local_98;
  code *local_90;
  undefined8 local_88;
  type local_80;
  NewConnectionCallback local_68;
  SourceFile local_38;
  string *local_28;
  string *nameArg_local;
  InetAddress *serverAddr_local;
  EventLoop *loop_local;
  TcpClient *this_local;
  
  local_28 = nameArg;
  nameArg_local = (string *)serverAddr;
  serverAddr_local = (InetAddress *)loop;
  loop_local = (EventLoop *)this;
  Logger::SourceFile::SourceFile<100>
            (&local_38,
             (char (*) [100])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
            );
  file.m_data = (char *)(ulong)(uint)local_38.m_size;
  file._8_8_ = 0x2c;
  pEVar2 = CheckNotNull<sznet::net::EventLoop>
                     ((sznet *)local_38.m_data,file,0x180a24,(char *)serverAddr_local,in_R9);
  this->m_loop = pEVar2;
  pCVar3 = (Connector *)operator_new(0x70);
  Connector::Connector(pCVar3,(EventLoop *)serverAddr_local,(InetAddress *)nameArg_local);
  std::shared_ptr<sznet::net::Connector>::shared_ptr<sznet::net::Connector,void>
            (&this->m_connector,pCVar3);
  std::__cxx11::string::string((string *)&this->m_name,(string *)local_28);
  std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
  function<void(&)(std::shared_ptr<sznet::net::TcpConnection>const&),void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)
             &this->m_connectionCallback,defaultConnectionCallback);
  std::
  function<void(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>
  ::
  function<void(&)(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp),void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>
              *)&this->m_messageCallback,defaultMessageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::function
            (&this->m_writeCompleteCallback);
  this->m_retry = false;
  this->m_connect = true;
  this->m_nextConnId = 1;
  MutexLock::MutexLock(&this->m_mutex);
  std::shared_ptr<sznet::net::TcpConnection>::shared_ptr(&this->m_connection);
  this_00 = std::
            __shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_connector);
  local_90 = newConnection;
  local_88 = 0;
  local_98 = this;
  std::bind<void(sznet::net::TcpClient::*)(int),sznet::net::TcpClient*,std::_Placeholder<1>const&>
            (&local_80,(offset_in_TcpClient_to_subr *)&local_90,&local_98,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(int)>::
  function<std::_Bind<void(sznet::net::TcpClient::*(sznet::net::TcpClient*,std::_Placeholder<1>))(int)>,void>
            ((function<void(int)> *)&local_68,&local_80);
  Connector::setNewConnectionCallback(this_00,&local_68);
  std::function<void_(int)>::~function(&local_68);
  LVar1 = Logger::logLevel();
  if ((int)LVar1 < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1078,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_1078._0_8_;
    file_00.m_size = local_1078._8_4_;
    Logger::Logger(&local_1068,file_00,0x37);
    this_01 = Logger::stream(&local_1068);
    psVar4 = LogStream::operator<<(this_01,"TcpClient::TcpClient[");
    psVar4 = LogStream::operator<<(psVar4,&this->m_name);
    psVar4 = LogStream::operator<<(psVar4,"] - connector ");
    pCVar3 = get_pointer<sznet::net::Connector>(&this->m_connector);
    LogStream::operator<<(psVar4,pCVar3);
    Logger::~Logger(&local_1068);
  }
  return;
}

Assistant:

TcpClient::TcpClient(EventLoop* loop, const InetAddress& serverAddr, const string& nameArg): 
	m_loop(CHECK_NOTNULL(loop)),
    m_connector(new Connector(loop, serverAddr)),
    m_name(nameArg),
    m_connectionCallback(defaultConnectionCallback),
    m_messageCallback(defaultMessageCallback),
    m_retry(false),
    m_connect(true),
    m_nextConnId(1)
{
	m_connector->setNewConnectionCallback(std::bind(&TcpClient::newConnection, this, std::placeholders::_1));
	// FIXME setConnectFailedCallback
	LOG_INFO << "TcpClient::TcpClient[" << m_name 
		<< "] - connector " << get_pointer(m_connector);
}